

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_trainFromBuffer_fastCover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_fastCover_params_t parameters)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  ZDICT_cover_params_t parameters_00;
  ZDICT_cover_params_t parameters_01;
  uint uVar3;
  ZDICT_fastCover_params_t ZVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  U16 *segmentFreqs;
  uint accel;
  uint f;
  char *__ptr;
  size_t sStackY_120;
  undefined8 uStack_d0;
  FASTCOVER_ctx_t ctx;
  
  ZVar4 = parameters;
  g_displayLevel = parameters.zParams.notificationLevel;
  f = 0x14;
  if (parameters.f != 0) {
    f = parameters.f;
  }
  accel = parameters.accel + (parameters.accel == 0);
  auVar1._8_4_ = parameters.steps;
  uVar3 = parameters.k;
  uVar5 = parameters.d;
  auVar1._0_4_ = parameters.k;
  auVar1._4_4_ = parameters.d;
  auVar1._12_4_ = parameters.nbThreads;
  uVar2 = ZVar4.zParams._0_8_;
  uStack_d0 = auVar1._8_8_;
  parameters_00.steps = (undefined4)uStack_d0;
  parameters_00.nbThreads = uStack_d0._4_4_;
  parameters_00.k = parameters.k;
  parameters_00.d = parameters.d;
  parameters_00.splitPoint._0_4_ = 0;
  parameters_00.splitPoint._4_4_ = 0x3ff00000;
  parameters_00.shrinkDict = parameters.shrinkDict;
  parameters_00.shrinkDictMaxRegression = 0;
  parameters_00.zParams.compressionLevel = (int)uVar2;
  parameters_00.zParams.notificationLevel = (int)((ulong)uVar2 >> 0x20);
  parameters_00.zParams.dictID = parameters.zParams.dictID;
  parameters_00._44_4_ = 0;
  iVar6 = FASTCOVER_checkParameters(parameters_00,dictBufferCapacity,f,accel);
  if (iVar6 == 0) {
    sVar7 = 0xffffffffffffffd6;
    if ((int)parameters.zParams.notificationLevel < 1) {
      return 0xffffffffffffffd6;
    }
    __ptr = "FASTCOVER parameters incorrect\n";
    sStackY_120 = 0x1f;
  }
  else if (nbSamples == 0) {
    sVar7 = 0xffffffffffffffb8;
    if ((int)parameters.zParams.notificationLevel < 1) {
      return 0xffffffffffffffb8;
    }
    __ptr = "FASTCOVER must have at least one input file\n";
    sStackY_120 = 0x2c;
  }
  else {
    if (dictBufferCapacity < 0x100) {
      sVar7 = 0xffffffffffffffba;
      if ((int)parameters.zParams.notificationLevel < 1) {
        return 0xffffffffffffffba;
      }
      fprintf(_stderr,"dictBufferCapacity must be at least %u\n",0x100);
      goto LAB_0017bff2;
    }
    sVar7 = FASTCOVER_ctx_init(&ctx,samplesBuffer,samplesSizes,nbSamples,ZVar4.d,1.0,f,
                               FASTCOVER_defaultAccelParameters[accel]);
    if (sVar7 < 0xffffffffffffff89) {
      COVER_warnOnSmallCorpus(dictBufferCapacity,ctx.nbDmers,g_displayLevel);
      if (1 < g_displayLevel) {
        fwrite("Building dictionary\n",0x14,1,_stderr);
        fflush(_stderr);
      }
      segmentFreqs = (U16 *)calloc(1L << ((byte)f & 0x3f),2);
      parameters_01.splitPoint._0_4_ = 0;
      parameters_01.k = uVar3;
      parameters_01.d = uVar5;
      parameters_01.steps = parameters.steps;
      parameters_01.nbThreads = parameters.nbThreads;
      parameters_01.splitPoint._4_4_ = 0x3ff00000;
      parameters_01.shrinkDict = parameters.shrinkDict;
      parameters_01.shrinkDictMaxRegression = 0;
      parameters_01.zParams.compressionLevel = (int)uVar2;
      parameters_01.zParams.notificationLevel = (int)((ulong)uVar2 >> 0x20);
      parameters_01.zParams.dictID = parameters.zParams.dictID;
      parameters_01._44_4_ = 0;
      sVar7 = FASTCOVER_buildDictionary
                        (&ctx,ctx.freqs,dictBuffer,dictBufferCapacity,parameters_01,segmentFreqs);
      sVar7 = ZDICT_finalizeDictionary
                        (dictBuffer,dictBufferCapacity,(void *)((long)dictBuffer + sVar7),
                         dictBufferCapacity - sVar7,samplesBuffer,samplesSizes,
                         (uint)((ctx.accelParams.finalize * ctx.nbTrainSamples) / 100),ZVar4.zParams
                        );
      if ((sVar7 < 0xffffffffffffff89) && (1 < g_displayLevel)) {
        fprintf(_stderr,"Constructed dictionary of size %u\n",sVar7 & 0xffffffff);
        fflush(_stderr);
      }
      FASTCOVER_ctx_destroy(&ctx);
      free(segmentFreqs);
      return sVar7;
    }
    if (g_displayLevel < 1) {
      return sVar7;
    }
    __ptr = "Failed to initialize context\n";
    sStackY_120 = 0x1d;
  }
  fwrite(__ptr,sStackY_120,1,_stderr);
LAB_0017bff2:
  fflush(_stderr);
  return sVar7;
}

Assistant:

ZDICTLIB_API size_t
ZDICT_trainFromBuffer_fastCover(void* dictBuffer, size_t dictBufferCapacity,
                                const void* samplesBuffer,
                                const size_t* samplesSizes, unsigned nbSamples,
                                ZDICT_fastCover_params_t parameters)
{
    BYTE* const dict = (BYTE*)dictBuffer;
    FASTCOVER_ctx_t ctx;
    ZDICT_cover_params_t coverParams;
    FASTCOVER_accel_t accelParams;
    /* Initialize global data */
    g_displayLevel = (int)parameters.zParams.notificationLevel;
    /* Assign splitPoint and f if not provided */
    parameters.splitPoint = 1.0;
    parameters.f = parameters.f == 0 ? DEFAULT_F : parameters.f;
    parameters.accel = parameters.accel == 0 ? DEFAULT_ACCEL : parameters.accel;
    /* Convert to cover parameter */
    memset(&coverParams, 0 , sizeof(coverParams));
    FASTCOVER_convertToCoverParams(parameters, &coverParams);
    /* Checks */
    if (!FASTCOVER_checkParameters(coverParams, dictBufferCapacity, parameters.f,
                                   parameters.accel)) {
      DISPLAYLEVEL(1, "FASTCOVER parameters incorrect\n");
      return ERROR(parameter_outOfBound);
    }
    if (nbSamples == 0) {
      DISPLAYLEVEL(1, "FASTCOVER must have at least one input file\n");
      return ERROR(srcSize_wrong);
    }
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
      DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                   ZDICT_DICTSIZE_MIN);
      return ERROR(dstSize_tooSmall);
    }
    /* Assign corresponding FASTCOVER_accel_t to accelParams*/
    accelParams = FASTCOVER_defaultAccelParameters[parameters.accel];
    /* Initialize context */
    {
      size_t const initVal = FASTCOVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples,
                            coverParams.d, parameters.splitPoint, parameters.f,
                            accelParams);
      if (ZSTD_isError(initVal)) {
        DISPLAYLEVEL(1, "Failed to initialize context\n");
        return initVal;
      }
    }
    COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.nbDmers, g_displayLevel);
    /* Build the dictionary */
    DISPLAYLEVEL(2, "Building dictionary\n");
    {
      /* Initialize array to keep track of frequency of dmer within activeSegment */
      U16* segmentFreqs = (U16 *)calloc(((U64)1 << parameters.f), sizeof(U16));
      const size_t tail = FASTCOVER_buildDictionary(&ctx, ctx.freqs, dictBuffer,
                                                dictBufferCapacity, coverParams, segmentFreqs);
      const unsigned nbFinalizeSamples = (unsigned)(ctx.nbTrainSamples * ctx.accelParams.finalize / 100);
      const size_t dictionarySize = ZDICT_finalizeDictionary(
          dict, dictBufferCapacity, dict + tail, dictBufferCapacity - tail,
          samplesBuffer, samplesSizes, nbFinalizeSamples, coverParams.zParams);
      if (!ZSTD_isError(dictionarySize)) {
          DISPLAYLEVEL(2, "Constructed dictionary of size %u\n",
                      (unsigned)dictionarySize);
      }
      FASTCOVER_ctx_destroy(&ctx);
      free(segmentFreqs);
      return dictionarySize;
    }
}